

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS ref_phys_spalding_uplus(REF_DBL yplus,REF_DBL *uplus)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  REF_DBL uplus_00;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  REF_DBL RVar7;
  REF_DBL dyplus_duplus;
  REF_DBL y;
  REF_DBL local_48;
  undefined8 uStack_40;
  double local_38;
  undefined8 uStack_30;
  
  uplus_00 = yplus;
  if (12.0 < yplus) {
    dVar4 = log(yplus / 0.1108);
    uplus_00 = dVar4 / 0.4;
  }
  bVar3 = true;
  iVar1 = 100;
  do {
    if (!bVar3) {
      *uplus = uplus_00;
      return 0;
    }
    ref_phys_spalding_yplus(uplus_00,&y);
    local_48 = y;
    uStack_40 = 0;
    local_38 = y - yplus;
    uStack_30 = 0;
    ref_phys_spalding_dyplus_duplus(uplus_00,&dyplus_duplus);
    auVar5._0_8_ = local_48 * 1e+20;
    auVar5._8_8_ = local_38;
    auVar6._8_8_ = -local_38;
    auVar6._0_8_ = -auVar5._0_8_;
    auVar6 = maxpd(auVar5,auVar6);
    dVar4 = auVar6._8_8_;
    if (auVar6._0_8_ <= dVar4) {
LAB_001c702f:
      bVar3 = dVar4 == 1e-15;
      bVar2 = dVar4 < 1e-15;
    }
    else {
      RVar7 = local_48;
      if (local_48 <= -local_48) {
        RVar7 = -local_48;
      }
      if (RVar7 <= 0.001) goto LAB_001c702f;
      dVar4 = local_38 / local_48;
      if (dVar4 <= -dVar4) {
        dVar4 = -dVar4;
      }
      bVar3 = dVar4 == 1e-12;
      bVar2 = dVar4 < 1e-12;
    }
    bVar3 = !bVar2 && !bVar3;
    uplus_00 = uplus_00 - local_38 / dyplus_duplus;
    iVar1 = iVar1 + -1;
    if (iVar1 == 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x2a4,
             "ref_phys_spalding_uplus","iteration count exceeded");
      printf(" y %e u %e err %e dydu %e\n",local_48,uplus_00,local_38,dyplus_duplus);
      return 1;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_phys_spalding_uplus(REF_DBL yplus, REF_DBL *uplus) {
  REF_DBL u, y, error, dyplus_duplus;
  REF_BOOL keep_going;
  REF_INT iters;
  u = yplus;
  if (u > 12) u = log(yplus / 0.1108) / 0.4;

  iters = 0;
  keep_going = REF_TRUE;
  while (keep_going) {
    RSS(ref_phys_spalding_yplus(u, &y), "yplus");
    error = y - yplus;

    RSS(ref_phys_spalding_dyplus_duplus(u, &dyplus_duplus), "dyplus");

    u = u - error / dyplus_duplus;

    if (ref_math_divisible(error, y) && ABS(y) > 1.0e-3) {
      keep_going = (ABS(error / y) > 1.0e-12);
    } else {
      keep_going = (ABS(error) > 1.0e-15);
    }

    iters++;
    RAB(iters < 100, "iteration count exceeded",
        { printf(" y %e u %e err %e dydu %e\n", y, u, error, dyplus_duplus); });
  }

  *uplus = u;

  return REF_SUCCESS;
}